

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

uint * RDL_listFamilies(RDL_data *data,uint object,char mode,char family)

{
  uint uVar1;
  uint uVar2;
  RDL_BCCGraph *pRVar3;
  void *__ptr;
  void *__ptr_00;
  uint *puVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lStack_80;
  ulong local_48;
  code *local_40;
  
  uVar6 = CONCAT71(in_register_00000011,mode);
  if (1 < (byte)(mode + 0x9fU)) {
    (*RDL_outputFunc)(RDL_ERROR,"tried to call \'RDL_listFamilies()\' with invalid mode \'%c\'\n",
                      0x62);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RingDecomposerLib.c"
                  ,0x385,
                  "unsigned int *RDL_listFamilies(const RDL_data *, unsigned int, char, char)");
  }
  if (family == 'u') {
    local_40 = RDL_giveURF;
    lStack_80 = 8;
  }
  else {
    if (family != 'r') {
      (*RDL_outputFunc)(RDL_ERROR,
                        "tried to call \'RDL_listFamilies()\' with invalid family \'%c\'\n",family);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RingDecomposerLib.c"
                    ,0x396,
                    "unsigned int *RDL_listFamilies(const RDL_data *, unsigned int, char, char)");
    }
    local_40 = RDL_giveRCF;
    lStack_80 = 0xc;
  }
  uVar1 = *(uint *)((long)&data->graph + lStack_80);
  __ptr = malloc(0x100);
  local_48 = 0x40;
  uVar10 = 0;
  uVar7 = 0;
  do {
    uVar11 = (ulong)uVar7;
    if (uVar10 == uVar1) {
      puVar4 = (uint *)realloc(__ptr,(ulong)(uVar7 + 1) << 2);
      puVar4[uVar11] = 0xffffffff;
      return puVar4;
    }
    if (family == 'u') {
      uVar6 = uVar10;
    }
    uVar6 = uVar6 & 0xffffffff;
    if (family == 'r') {
      uVar6 = (ulong)data->rcf_to_urf[uVar10][0];
    }
    pRVar3 = data->bccGraphs;
    uVar5 = data->urf_to_bcc[uVar6][0];
    if (mode == 'a') {
      uVar8 = 0;
      do {
        if ((ulong)pRVar3->nof_bcc_per_node[object] * 2 + 2 == uVar8 + 2) goto LAB_00106226;
        uVar9 = uVar8 & 0xffffffff;
        uVar8 = uVar8 + 2;
      } while (pRVar3->node_to_bcc_mapping[object][uVar9] != uVar5);
LAB_0010619e:
      __ptr_00 = (void *)(*local_40)(data,uVar10 & 0xffffffff,(int)mode);
      uVar5 = 0;
      do {
        uVar2 = *(uint *)((long)__ptr_00 + (ulong)uVar5 * 4);
        if (uVar2 == 0xffffffff) break;
        uVar5 = uVar5 + 1;
      } while (uVar2 != object);
      free(__ptr_00);
      if (uVar2 != 0xffffffff) {
        if (uVar7 == (uint)local_48) {
          local_48 = (ulong)(uVar7 * 2);
          __ptr = realloc(__ptr,local_48 * 4);
        }
        uVar7 = uVar7 + 1;
        *(int *)((long)__ptr + uVar11 * 4) = (int)uVar10;
      }
    }
    else if (*pRVar3->edge_to_bcc_mapping[object] == uVar5) goto LAB_0010619e;
LAB_00106226:
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

static unsigned *RDL_listFamilies(const RDL_data *data, unsigned object,
    char mode, char family)
{
  unsigned *result;
  unsigned nof_families;
  unsigned nextfree=0, alloced=RDL_RESERVED_START;
  unsigned *objects;
  unsigned i,j, bcc_index, target_bcc, urf_index;
  char contained, can_be_contained;

  if(!(mode == 'a' || mode == 'b'))
  {
    RDL_outputFunc(RDL_ERROR, "tried to call 'RDL_listFamilies()' with invalid mode '%c'\n",mode);
    /* cannot occur when using interface */
    assert(0);
    return NULL;
  }

  unsigned* (*giveFamily) (const RDL_data*, unsigned, char) = NULL;

  if (family == 'u') {
    nof_families = data->nofURFs;
    giveFamily = RDL_giveURF;
  }
  else if (family == 'r') {
    nof_families = data->nofRCFs;
    giveFamily = RDL_giveRCF;
  }
  else {
    RDL_outputFunc(RDL_ERROR, "tried to call 'RDL_listFamilies()' with invalid family '%c'\n",family);
    /* cannot occur when using interface */
    assert(0);
    return NULL;
  }

  result=malloc(alloced * sizeof(*result));
  for(i = 0; i < nof_families; ++i)
  {
    if (family == 'u') {
      urf_index = i;
    }
    else if (family == 'r') {
      urf_index = data->rcf_to_urf[i][0];
    }

    bcc_index = data->urf_to_bcc[urf_index][0];

    /*
     * check if object belongs to this BCC at all,
     * if not it can't be in the URF either
     */
    can_be_contained = 0;
    if (mode == 'a') {
      for (j = 0; j < data->bccGraphs->nof_bcc_per_node[object]; ++j) {
        target_bcc = data->bccGraphs->node_to_bcc_mapping[object][2*j];
        if (target_bcc == bcc_index) {
          can_be_contained = 1;
          break;
        }
      }
    }
    else {
      target_bcc = data->bccGraphs->edge_to_bcc_mapping[object][0];
      if (target_bcc == bcc_index) {
        can_be_contained = 1;
      }
    }

    contained = 0;
    if (can_be_contained) {
      objects = giveFamily(data, i, mode);
      for(j=0; objects[j]<UINT_MAX; ++j)
      {
        if(objects[j] == object)
        {
          contained = 1;
          break;
        }
      }
      free(objects);
    }
    if (contained) {
      if(nextfree == alloced) {
        alloced *= 2;
        result = realloc(result, alloced*sizeof(*result));
      }
      result[nextfree++] = i;
    }
  }

  result = realloc(result, (nextfree+1)*sizeof(*result));
  result[nextfree] = UINT_MAX;
  return result;
}